

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O0

void Intp_ManUnsatCore_rec
               (Vec_Ptr_t *vAntClas,int iThis,Vec_Int_t *vCore,int nRoots,Vec_Str_t *vVisited,
               int fLearned)

{
  char cVar1;
  int iVar2;
  Vec_Int_t *p;
  undefined4 local_44;
  int Entry;
  int i;
  Vec_Int_t *vAnt;
  int fLearned_local;
  Vec_Str_t *vVisited_local;
  int nRoots_local;
  Vec_Int_t *vCore_local;
  int iThis_local;
  Vec_Ptr_t *vAntClas_local;
  
  cVar1 = Vec_StrEntry(vVisited,iThis);
  if (cVar1 == '\0') {
    Vec_StrWriteEntry(vVisited,iThis,'\x01');
    if (iThis < nRoots) {
      if (fLearned == 0) {
        Vec_IntPush(vCore,iThis);
      }
    }
    else {
      p = (Vec_Int_t *)Vec_PtrEntry(vAntClas,iThis - nRoots);
      for (local_44 = 0; iVar2 = Vec_IntSize(p), local_44 < iVar2; local_44 = local_44 + 1) {
        iVar2 = Vec_IntEntry(p,local_44);
        Intp_ManUnsatCore_rec(vAntClas,iVar2,vCore,nRoots,vVisited,fLearned);
      }
      if (fLearned != 0) {
        Vec_IntPush(vCore,iThis);
      }
    }
  }
  return;
}

Assistant:

void Intp_ManUnsatCore_rec( Vec_Ptr_t * vAntClas, int iThis, Vec_Int_t * vCore, int nRoots, Vec_Str_t * vVisited, int fLearned )
{
//    int i, iStop, iStart;
    Vec_Int_t * vAnt;
    int i, Entry;
    // skip visited clauses
    if ( Vec_StrEntry( vVisited, iThis ) )
        return;
    Vec_StrWriteEntry( vVisited, iThis, 1 );
    // add a root clause to the core
    if ( iThis < nRoots )
    {
        if ( !fLearned )
            Vec_IntPush( vCore, iThis );
        return; 
    }
    // iterate through the clauses
//    iStart = Vec_IntEntry( vBreaks, iThis );
//    iStop = Vec_IntEntry( vBreaks, iThis+1 );
//    assert( iStop != -1 );
//    for ( i = iStart; i < iStop; i++ )
    vAnt = (Vec_Int_t *)Vec_PtrEntry( vAntClas, iThis - nRoots );
    Vec_IntForEachEntry( vAnt, Entry, i )
//        Intp_ManUnsatCore_rec( vAntClas, Vec_IntEntry(vAnties, i), vCore, nRoots, vVisited );
        Intp_ManUnsatCore_rec( vAntClas, Entry, vCore, nRoots, vVisited, fLearned );
    // collect learned clause
    if ( fLearned )
        Vec_IntPush( vCore, iThis );
}